

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O3

value_type __thiscall
FadBinaryMinus<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<FadExpr<FadFuncCos<Fad<double>_>_>_>_>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadFuncSin<Fad<double>_>_>,_FadExpr<FadFuncSin<Fad<double>_>_>_>_>_>
::fastAccessDx(FadBinaryMinus<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<FadExpr<FadFuncCos<Fad<double>_>_>_>_>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadFuncSin<Fad<double>_>_>,_FadExpr<FadFuncSin<Fad<double>_>_>_>_>_>
               *this,int i)

{
  double dVar1;
  double dVar2;
  FadExpr<FadBinaryMul<FadExpr<FadFuncSin<Fad<double>_>_>,_FadExpr<FadFuncSin<Fad<double>_>_>_>_>
  *pFVar3;
  FadExpr<FadFuncSin<Fad<double>_>_> *pFVar4;
  value_type vVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  
  vVar5 = FadBinaryMul<FadExpr<FadUnaryMin<FadExpr<FadFuncCos<Fad<double>_>_>_>_>,_FadExpr<FadFuncCos<Fad<double>_>_>_>
          ::fastAccessDx(&this->left_->fadexpr_,i);
  pFVar3 = this->right_;
  pFVar4 = (pFVar3->fadexpr_).left_;
  dVar1 = (pFVar4->fadexpr_).expr_.dx_.ptr_to_data[i];
  dVar6 = cos((pFVar4->fadexpr_).expr_.val_);
  dVar7 = sin((((pFVar3->fadexpr_).right_)->fadexpr_).expr_.val_);
  pFVar4 = (pFVar3->fadexpr_).right_;
  dVar2 = (pFVar4->fadexpr_).expr_.dx_.ptr_to_data[i];
  dVar8 = cos((pFVar4->fadexpr_).expr_.val_);
  dVar9 = sin((((pFVar3->fadexpr_).left_)->fadexpr_).expr_.val_);
  return vVar5 - (dVar7 * dVar6 * dVar1 + dVar9 * dVar8 * dVar2);
}

Assistant:

value_type fastAccessDx(int i) const { return left_.fastAccessDx(i) - right_.fastAccessDx(i);}